

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_8x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int16_t *tmp;
  int16_t *botL;
  int16_t *topL;
  long lVar2;
  
  lVar1 = in_RDI + (long)(in_EDX << 3) * 2;
  lVar2 = lVar1;
  if (in_ECX != 0) {
    lVar2 = in_RDI;
    in_RDI = lVar1;
  }
  load_buffer_8x8((int16_t *)CONCAT44(in_EDX,in_ECX),(__m128i *)CONCAT44(in_R8D,in_R9D),
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)lVar2 >> 0x20),(int)lVar2);
  load_buffer_8x8((int16_t *)CONCAT44(in_EDX,in_ECX),(__m128i *)CONCAT44(in_R8D,in_R9D),
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)lVar2 >> 0x20),(int)lVar2);
  return;
}

Assistant:

static inline void load_buffer_8x16(const int16_t *input, __m128i *out,
                                    int stride, int flipud, int fliplr,
                                    int shift) {
  const int16_t *topL = input;
  const int16_t *botL = input + 8 * stride;

  const int16_t *tmp;

  if (flipud) {
    tmp = topL;
    topL = botL;
    botL = tmp;
  }

  load_buffer_8x8(topL, out, stride, flipud, fliplr, shift);
  load_buffer_8x8(botL, out + 16, stride, flipud, fliplr, shift);
}